

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::tracker_error_alert::~tracker_error_alert(tracker_error_alert *this)

{
  ~tracker_error_alert(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

struct TORRENT_EXPORT tracker_error_alert final : tracker_alert
	{
		// internal
		tracker_error_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, tcp::endpoint const& ep
			, int times, string_view u
			, error_code const& e, string_view m);

		TORRENT_DEFINE_ALERT_PRIO(tracker_error_alert, 11, alert_priority_high)

		static constexpr alert_category_t static_category = alert_category::tracker | alert_category::error;
		std::string message() const override;

		int const times_in_row;
		error_code const error;

		// the message associated with this error
		char const* error_message() const;

	private:
		aux::allocation_slot m_msg_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		int const TORRENT_DEPRECATED_MEMBER status_code;
		std::string TORRENT_DEPRECATED_MEMBER msg;
#endif
	}